

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressionValidatorTests.cpp
# Opt level: O0

int testBayesianProbitRegressionValidationBasic(void)

{
  bool bVar1;
  ArrayFeatureType *this;
  FeatureType *this_00;
  ArrayFeatureType *this_01;
  FeatureType *this_02;
  ModelDescription *this_03;
  FeatureDescription *this_04;
  ostream *poVar2;
  Result local_e0;
  undefined1 local_b0 [48];
  Model model;
  FeatureDescription *output;
  FeatureDescription *input;
  ModelDescription *description;
  FeatureType *outputFeatureType;
  ArrayFeatureType *outputArrayFeatureType;
  FeatureType *inputFeatureType;
  ArrayFeatureType *inputArrayFeatureType;
  
  this = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this);
  CoreML::Specification::ArrayFeatureType::add_shape(this,10);
  CoreML::Specification::ArrayFeatureType::add_shape(this,10);
  this_00 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_00);
  CoreML::Specification::FeatureType::set_allocated_multiarraytype(this_00,this);
  this_01 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this_01);
  CoreML::Specification::ArrayFeatureType::add_shape(this_01,10);
  this_02 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_02);
  CoreML::Specification::FeatureType::set_allocated_multiarraytype(this_02,this_01);
  this_03 = (ModelDescription *)operator_new(0x78);
  CoreML::Specification::ModelDescription::ModelDescription(this_03);
  this_04 = CoreML::Specification::ModelDescription::add_input(this_03);
  model._40_8_ = CoreML::Specification::ModelDescription::add_output(this_03);
  CoreML::Specification::FeatureDescription::set_allocated_type(this_04,this_00);
  CoreML::Specification::FeatureDescription::set_allocated_type
            ((FeatureDescription *)model._40_8_,this_02);
  CoreML::Specification::Model::Model((Model *)(local_b0 + 0x28));
  CoreML::Specification::Model::set_allocated_description((Model *)(local_b0 + 0x28),this_03);
  CoreML::validate<(MLModelType)304>((Result *)local_b0,(Model *)(local_b0 + 0x28));
  bVar1 = CoreML::Result::good((Result *)local_b0);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/BayesianProbitRegressionValidatorTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2b);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"!((result).good())");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    inputArrayFeatureType._4_4_ = 1;
  }
  else {
    CoreML::Specification::ArrayFeatureType::set_datatype(this,ArrayFeatureType_ArrayDataType_INT32)
    ;
    CoreML::validate<(MLModelType)304>(&local_e0,(Model *)(local_b0 + 0x28));
    CoreML::Result::operator=((Result *)local_b0,&local_e0);
    CoreML::Result::~Result(&local_e0);
    bVar1 = CoreML::Result::good((Result *)local_b0);
    if (bVar1) {
      inputArrayFeatureType._4_4_ = 0;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/BayesianProbitRegressionValidatorTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x30);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"(result).good()");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      inputArrayFeatureType._4_4_ = 1;
    }
  }
  local_e0.m_message._M_storage._M_storage[4] = '\x01';
  local_e0.m_message._M_storage._M_storage[5] = '\0';
  local_e0.m_message._M_storage._M_storage[6] = '\0';
  local_e0.m_message._M_storage._M_storage[7] = '\0';
  CoreML::Result::~Result((Result *)local_b0);
  CoreML::Specification::Model::~Model((Model *)(local_b0 + 0x28));
  return inputArrayFeatureType._4_4_;
}

Assistant:

int testBayesianProbitRegressionValidationBasic () {

    Specification::ArrayFeatureType* inputArrayFeatureType = new Specification::ArrayFeatureType();
    inputArrayFeatureType->add_shape(10);
    inputArrayFeatureType->add_shape(10);

    Specification::FeatureType* inputFeatureType = new Specification::FeatureType();
    inputFeatureType->set_allocated_multiarraytype(inputArrayFeatureType);

    Specification::ArrayFeatureType* outputArrayFeatureType = new Specification::ArrayFeatureType();
    outputArrayFeatureType->add_shape(10);

    Specification::FeatureType* outputFeatureType = new Specification::FeatureType();
    outputFeatureType->set_allocated_multiarraytype(outputArrayFeatureType);

    Specification::ModelDescription* description = new Specification::ModelDescription();
    Specification::FeatureDescription* input = description->add_input();
    Specification::FeatureDescription* output = description->add_output();
    input->set_allocated_type(inputFeatureType);
    output->set_allocated_type(outputFeatureType);

    Specification::Model model;
    model.set_allocated_description(description);

    Result result = validate<MLModelType_bayesianProbitRegressor>(model);
    ML_ASSERT_BAD(result);

    inputArrayFeatureType->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);

    result = validate<MLModelType_bayesianProbitRegressor>(model);
    ML_ASSERT_GOOD(result);

    return 0;
}